

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool __thiscall
google::protobuf::FileDescriptor::GetSourceLocation
          (FileDescriptor *this,vector<int,_std::allocator<int>_> *path,SourceLocation *out_location
          )

{
  int iVar1;
  int extraout_EAX;
  int *piVar2;
  const_reference piVar3;
  Rep *pRVar4;
  Nonnull<const_char_*> pcVar5;
  SourceLocation *unaff_RBX;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar6;
  SourceCodeInfo_Location *unaff_R14;
  RepeatedField<int> *unaff_R15;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  
  if (out_location == (SourceLocation *)0x0) {
    GetSourceLocation();
    iVar1 = extraout_EAX;
  }
  else {
    if ((this->source_code_info_ == (SourceCodeInfo *)0x0) ||
       (unaff_R14 = FileDescriptorTables::GetSourceLocation
                              (this->tables_,path,this->source_code_info_),
       unaff_R14 == (SourceCodeInfo_Location *)0x0)) {
      return false;
    }
    unaff_R15 = &(unaff_R14->field_0)._impl_.span_;
    iVar1 = internal::SooRep::size
                      (&unaff_R15->soo_rep_,(*(byte *)((long)&unaff_R14->field_0 + 0x20) & 4) == 0);
    if ((iVar1 != 3) &&
       (iVar1 = internal::SooRep::size
                          (&unaff_R15->soo_rep_,
                           (undefined1  [16])
                           ((undefined1  [16])(unaff_R15->soo_rep_).field_0 & (undefined1  [16])0x4)
                           == (undefined1  [16])0x0), iVar1 != 4)) {
      return false;
    }
    iVar1 = internal::SooRep::size
                      (&unaff_R15->soo_rep_,
                       (undefined1  [16])
                       ((undefined1  [16])(unaff_R15->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                       (undefined1  [16])0x0);
    unaff_RBX = out_location;
    if (0 < iVar1) {
      pcVar5 = (Nonnull<const_char_*>)0x0;
      goto LAB_001c34df;
    }
  }
  pcVar5 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                     (0,(long)iVar1,"index < size()");
LAB_001c34df:
  if (pcVar5 == (Nonnull<const_char_*>)0x0) {
    piVar2 = RepeatedField<int>::elements
                       (unaff_R15,
                        (undefined1  [16])
                        ((undefined1  [16])(unaff_R15->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                        (undefined1  [16])0x0);
    unaff_RBX->start_line = *piVar2;
    iVar1 = internal::SooRep::size
                      (&unaff_R15->soo_rep_,
                       (undefined1  [16])
                       ((undefined1  [16])(unaff_R15->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                       (undefined1  [16])0x0);
    if (iVar1 < 2) {
      pcVar5 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         (1,(long)iVar1,"index < size()");
    }
    else {
      pcVar5 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar5 == (Nonnull<const_char_*>)0x0) {
      piVar2 = RepeatedField<int>::elements
                         (unaff_R15,(*(byte *)((long)&unaff_R14->field_0 + 0x20) & 4) == 0);
      unaff_RBX->start_column = piVar2[1];
      iVar1 = internal::SooRep::size
                        (&unaff_R15->soo_rep_,(*(byte *)((long)&unaff_R14->field_0 + 0x20) & 4) == 0
                        );
      piVar3 = RepeatedField<int>::Get(unaff_R15,(uint)(iVar1 != 3) * 2);
      unaff_RBX->end_line = *piVar3;
      iVar1 = internal::SooRep::size
                        (&unaff_R15->soo_rep_,(*(byte *)((long)&unaff_R14->field_0 + 0x20) & 4) == 0
                        );
      piVar3 = RepeatedField<int>::Get(unaff_R15,iVar1 + -1);
      unaff_RBX->end_column = *piVar3;
      std::__cxx11::string::_M_assign((string *)&unaff_RBX->leading_comments);
      std::__cxx11::string::_M_assign((string *)&unaff_RBX->trailing_comments);
      this_00 = &(unaff_R14->field_0)._impl_.leading_detached_comments_;
      pRVar6 = this_00;
      if ((*(byte *)((long)&unaff_R14->field_0 + 0x38) & 1) != 0) {
        pRVar4 = internal::RepeatedPtrFieldBase::rep(&this_00->super_RepeatedPtrFieldBase);
        pRVar6 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)pRVar4->elements;
      }
      if (((ulong)(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
        pRVar4 = internal::RepeatedPtrFieldBase::rep(&this_00->super_RepeatedPtrFieldBase);
        this_00 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)pRVar4->elements;
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_assign_aux<google::protobuf::internal::RepeatedPtrIterator<std::__cxx11::string_const>>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &unaff_RBX->leading_detached_comments,pRVar6,
                 &(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ +
                 *(int *)((long)&unaff_R14->field_0 + 0x40));
      return true;
    }
  }
  else {
    GetSourceLocation();
  }
  GetSourceLocation();
}

Assistant:

bool FileDescriptor::GetSourceLocation(const std::vector<int>& path,
                                       SourceLocation* out_location) const {
  ABSL_CHECK(out_location != nullptr);
  if (source_code_info_) {
    if (const SourceCodeInfo_Location* loc =
            tables_->GetSourceLocation(path, source_code_info_)) {
      const RepeatedField<int32_t>& span = loc->span();
      if (span.size() == 3 || span.size() == 4) {
        out_location->start_line = span.Get(0);
        out_location->start_column = span.Get(1);
        out_location->end_line = span.Get(span.size() == 3 ? 0 : 2);
        out_location->end_column = span.Get(span.size() - 1);

        out_location->leading_comments = loc->leading_comments();
        out_location->trailing_comments = loc->trailing_comments();
        out_location->leading_detached_comments.assign(
            loc->leading_detached_comments().begin(),
            loc->leading_detached_comments().end());
        return true;
      }
    }
  }
  return false;
}